

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiGetTXMarkerInfo(ndicapi *pol,int ph,int marker)

{
  uint uVar1;
  int iVar2;
  unsigned_long uVar3;
  ulong uVar4;
  
  uVar1 = pol->TxHandleCount;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    do {
      if ((uint)pol->TxHandles[uVar4] == ph) goto LAB_001093ac;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    uVar4 = (ulong)uVar1;
  }
LAB_001093ac:
  iVar2 = 1;
  if (((uint)marker < 0x14) && ((uint)uVar4 != uVar1)) {
    uVar3 = ndiHexToUnsignedLong(pol->TxInformation[marker + 2],1);
    iVar2 = (int)uVar3;
  }
  return iVar2;
}

Assistant:

ndicapiExport int ndiGetTXMarkerInfo(ndicapi* pol, int ph, int marker)
{
  char* dp;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == ph)
    {
      break;
    }
  }
  if (i == n || marker < 0 || marker >= 20)
  {
    return NDI_DISABLED;
  }

  dp = pol->TxInformation[2 + marker];
  return (int)ndiHexToUnsignedLong(dp, 1);
}